

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Prog * duckdb_re2::Compiler::Compile(Regexp *re,bool reversed,int64_t max_mem)

{
  Regexp *this;
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  Prog *pPVar4;
  bool bVar5;
  ulong uVar6;
  Frag FVar7;
  Frag FVar8;
  Frag a;
  Frag a_00;
  Frag b;
  Regexp *sre;
  Regexp *local_130;
  undefined4 local_128;
  undefined8 uStack_124;
  uint uStack_11c;
  Compiler local_118;
  
  Compiler(&local_118);
  if ((re->parse_flags_ & 0x20) != 0) {
    local_118.encoding_ = kEncodingLatin1;
  }
  if (max_mem < 1) {
    local_118.max_ninst_ = 100000;
  }
  else {
    local_118.max_ninst_ = 0;
    if (0x1b0 < (ulong)max_mem) {
      local_118.max_ninst_ = 0x1000000;
      if (max_mem - 0x1b0U < 0x8000000) {
        local_118.max_ninst_ = (int)(max_mem - 0x1b0U >> 3);
      }
    }
  }
  local_118.anchor_ = UNANCHORED;
  local_118.reversed_ = reversed;
  local_118.max_mem_ = max_mem;
  local_130 = Regexp::Simplify(re);
  if (local_130 != (Regexp *)0x0) {
    bVar1 = IsAnchorStart(&local_130,0);
    bVar2 = IsAnchorEnd(&local_130,0);
    this = local_130;
    local_128 = 0;
    uStack_124 = 0;
    uStack_11c = uStack_11c & 0xffffff00;
    local_118.super_Walker<duckdb_re2::Frag>.max_visits_ = local_118.max_ninst_ * 2;
    FVar7._12_4_ = uStack_11c;
    FVar7.begin = 0;
    FVar7.end.head = 0;
    FVar7.end.tail = 0;
    FVar7 = Regexp::Walker<duckdb_re2::Frag>::WalkInternal
                      (&local_118.super_Walker<duckdb_re2::Frag>,local_130,FVar7,false);
    Regexp::Decref(this);
    if (local_118.failed_ == false) {
      local_118.reversed_ = false;
      FVar8 = Match(&local_118,0);
      uVar6 = FVar7._8_8_ & 0xffffffffff;
      b._8_8_ = FVar8._8_8_ & 0xffffffffff;
      a.end.tail = (int)uVar6;
      a.nullable = (bool)(char)(uVar6 >> 0x20);
      a._13_3_ = (int3)(uVar6 >> 0x28);
      a.begin = (int)FVar7._0_8_;
      a.end.head = (int)((ulong)FVar7._0_8_ >> 0x20);
      b.begin = (int)FVar8._0_8_;
      b.end.head = (int)((ulong)FVar8._0_8_ >> 0x20);
      FVar7 = Cat(&local_118,a,b);
      uVar3 = FVar7._0_8_;
      (local_118.prog_)->reversed_ = reversed;
      bVar5 = bVar2;
      if (reversed) {
        bVar5 = bVar1;
        bVar1 = bVar2;
      }
      (local_118.prog_)->anchor_start_ = bVar1;
      (local_118.prog_)->anchor_end_ = bVar5;
      (local_118.prog_)->start_ = FVar7.begin;
      if (bVar1 == false) {
        FVar8 = DotStar(&local_118);
        uVar6 = FVar7._8_8_ & 0xffffffffff;
        a_00._8_8_ = FVar8._8_8_ & 0xffffffffff;
        a_00.begin = (int)FVar8._0_8_;
        a_00.end.head = (int)((ulong)FVar8._0_8_ >> 0x20);
        FVar8.end.tail = (int)uVar6;
        FVar8.nullable = (bool)(char)(uVar6 >> 0x20);
        FVar8._13_3_ = (int3)(uVar6 >> 0x28);
        FVar8.begin = (int)uVar3;
        FVar8.end.head = (int)((ulong)uVar3 >> 0x20);
        FVar7 = Cat(&local_118,a_00,FVar8);
        uVar3 = FVar7._0_8_;
      }
      (local_118.prog_)->start_unanchored_ = (int)uVar3;
      pPVar4 = Finish(&local_118,re);
      goto LAB_01cd2ff2;
    }
  }
  pPVar4 = (Prog *)0x0;
LAB_01cd2ff2:
  ~Compiler(&local_118);
  return pPVar4;
}

Assistant:

Prog* Compiler::Compile(Regexp* re, bool reversed, int64_t max_mem) {
  Compiler c;
  c.Setup(re->parse_flags(), max_mem, RE2::UNANCHORED /* unused */);
  c.reversed_ = reversed;

  // Simplify to remove things like counted repetitions
  // and character classes like \d.
  Regexp* sre = re->Simplify();
  if (sre == NULL)
    return NULL;

  // Record whether prog is anchored, removing the anchors.
  // (They get in the way of other optimizations.)
  bool is_anchor_start = IsAnchorStart(&sre, 0);
  bool is_anchor_end = IsAnchorEnd(&sre, 0);

  // Generate fragment for entire regexp.
  Frag all = c.WalkExponential(sre, Frag(), 2*c.max_ninst_);
  sre->Decref();
  if (c.failed_)
    return NULL;

  // Success!  Finish by putting Match node at end, and record start.
  // Turn off c.reversed_ (if it is set) to force the remaining concatenations
  // to behave normally.
  c.reversed_ = false;
  all = c.Cat(all, c.Match(0));

  c.prog_->set_reversed(reversed);
  if (c.prog_->reversed()) {
    c.prog_->set_anchor_start(is_anchor_end);
    c.prog_->set_anchor_end(is_anchor_start);
  } else {
    c.prog_->set_anchor_start(is_anchor_start);
    c.prog_->set_anchor_end(is_anchor_end);
  }

  c.prog_->set_start(all.begin);
  if (!c.prog_->anchor_start()) {
    // Also create unanchored version, which starts with a .*? loop.
    all = c.Cat(c.DotStar(), all);
  }
  c.prog_->set_start_unanchored(all.begin);

  // Hand ownership of prog_ to caller.
  return c.Finish(re);
}